

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O2

void __thiscall
sf::Shader::setUniformArray(Shader *this,string *name,Vec2 *vectorArray,size_t length)

{
  size_t i;
  size_t sVar1;
  GLfloat *pGVar2;
  UniformBinder binder;
  vector<float,_std::allocator<float>_> contiguous;
  UniformBinder local_50;
  _Vector_base<float,_std::allocator<float>_> local_40;
  
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_40,length * 2,
             (allocator_type *)&local_50);
  for (sVar1 = 0; length != sVar1; sVar1 = sVar1 + 1) {
    local_40._M_impl.super__Vector_impl_data._M_start[sVar1 * 2] = vectorArray[sVar1].x;
    local_40._M_impl.super__Vector_impl_data._M_start[sVar1 * 2 + 1] = vectorArray[sVar1].y;
  }
  UniformBinder::UniformBinder(&local_50,this,name);
  if (local_50.location != -1) {
    pGVar2 = (GLfloat *)0x0;
    if (local_40._M_impl.super__Vector_impl_data._M_start !=
        local_40._M_impl.super__Vector_impl_data._M_finish) {
      pGVar2 = local_40._M_impl.super__Vector_impl_data._M_start;
    }
    (*sf_glad_glUniform2fvARB)(local_50.location,(GLsizei)length,pGVar2);
  }
  UniformBinder::~UniformBinder(&local_50);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_40);
  return;
}

Assistant:

void Shader::setUniformArray(const std::string& name, const Glsl::Vec2* vectorArray, std::size_t length)
{
    std::vector<float> contiguous = flatten(vectorArray, length);

    UniformBinder binder(*this, name);
    if (binder.location != -1)
        glCheck(GLEXT_glUniform2fv(binder.location, static_cast<GLsizei>(length), !contiguous.empty() ? &contiguous[0] : NULL));
}